

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

char * mp_decode_ext(char **data,int8_t *type,uint32_t *len)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  
  if (len != (uint32_t *)0x0) {
    pcVar2 = *data;
    cVar1 = *pcVar2;
    pcVar4 = pcVar2 + 1;
    *data = pcVar4;
    switch(cVar1) {
    case -0x39:
      uVar3 = (uint)(byte)pcVar2[1];
      pcVar4 = pcVar2 + 2;
      break;
    case -0x38:
      pcVar4 = pcVar2 + 3;
      uVar3 = (uint)(ushort)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
      break;
    case -0x37:
      uVar3 = *(uint *)(pcVar2 + 1);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      pcVar4 = pcVar2 + 5;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (cVar1 + 0x2cU & 0x1f);
    }
    cVar1 = *pcVar4;
    *data = pcVar4 + 1;
    *type = cVar1;
    *len = uVar3;
    pcVar4 = *data;
    *data = pcVar4 + uVar3;
    return pcVar4;
  }
  __assert_fail("len != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x86f,"const char *mp_decode_ext(const char **, int8_t *, uint32_t *)");
}

Assistant:

MP_IMPL const char *
mp_decode_ext(const char **data, int8_t *type, uint32_t *len) {
	assert(len != NULL);

	*len = mp_decode_extl(data, type);
	const char *str = *data;
	*data += *len;
	return str;
}